

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsAddress.cpp
# Opt level: O2

void __thiscall Scs::Address::Address(Address *this,String *port,bool passive)

{
  uint uVar1;
  undefined7 in_register_00000011;
  addrinfo hints;
  addrinfo local_38;
  
  this->m_address = (addrinfo *)0x0;
  local_38.ai_protocol = 0;
  local_38.ai_canonname = (char *)0x0;
  local_38.ai_next = (addrinfo *)0x0;
  local_38.ai_addrlen = 0;
  local_38._20_4_ = 0;
  local_38.ai_addr = (sockaddr *)0x0;
  local_38.ai_family = 2;
  local_38.ai_socktype = 1;
  local_38.ai_flags = (int)((int)CONCAT71(in_register_00000011,passive) != 0);
  uVar1 = getaddrinfo((char *)0x0,(port->_M_dataplus)._M_p,&local_38,(addrinfo **)this);
  if (uVar1 != 0) {
    LogWriteLine("getaddrinfo failed: %d",(ulong)uVar1);
  }
  this->m_current = this->m_address;
  Log(this);
  return;
}

Assistant:

Address::Address(const String & port, bool passive)
{
	// Server setup

	// Set up structures
	m_address = NULL;
	addrinfo hints;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // Note: Windows fails to connect if left unspecified
	hints.ai_socktype = SOCK_STREAM;
	//hints.ai_protocol = IPPROTO_TCP;
	if (passive)
		hints.ai_flags = AI_PASSIVE;

	// Resolve the port to be used by the socket
	int result = getaddrinfo(nullptr, port.c_str(), &hints, &m_address);
	if (result != 0)
	{
		LogWriteLine("getaddrinfo failed: %d", result);
	}
	m_current = m_address;
	Log();
}